

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# njd_set_accent_type.c
# Opt level: O0

char get_token_from_string(char *str,int *index,char *buff)

{
  int iVar1;
  bool bVar2;
  int i;
  char c;
  char *buff_local;
  int *index_local;
  char *str_local;
  
  i = 0;
  c = str[*index];
  if (c != '\0') {
    while( true ) {
      bVar2 = false;
      if (((c != '%') && (bVar2 = false, c != '@')) && (bVar2 = false, c != '/')) {
        bVar2 = c != '\0';
      }
      if (!bVar2) break;
      buff[i] = c;
      iVar1 = *index;
      *index = iVar1 + 1;
      c = str[iVar1 + 1];
      i = i + 1;
    }
    if (((c == '%') || (c == '@')) || (c == '/')) {
      *index = *index + 1;
    }
  }
  buff[i] = '\0';
  return c;
}

Assistant:

static char get_token_from_string(const char *str, int *index, char *buff)
{
   char c;
   int i = 0;

   c = str[(*index)];
   if (c != '\0') {
      while (c != '%' && c != '@' && c != '/' && c != '\0') {
         buff[i++] = c;
         c = str[++(*index)];
      }
      if (c == '%' || c == '@' || c == '/')
         (*index)++;
   }
   buff[i] = '\0';
   return c;
}